

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O0

NextTask * __thiscall
dd::TaskQueueStdlib::GetNextTask(NextTask *__return_storage_ptr__,TaskQueueStdlib *this)

{
  rep rVar1;
  size_type sVar2;
  pointer ppVar3;
  pointer ppVar4;
  size_type sVar5;
  reference pvVar6;
  value_type *entry_1;
  unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *entry_run;
  unsigned_long *entry_order;
  value_type *entry;
  unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *delay_run;
  DelayedEntryTimeout *delay_info;
  iterator delayed_entry;
  AutoLock local_40;
  AutoLock lock;
  rep tick;
  TaskQueueStdlib *this_local;
  NextTask *result;
  
  __return_storage_ptr__->_final_task = false;
  std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>::
  unique_ptr<std::default_delete<dd::QueuedTask>,void>
            ((unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>> *)
             &__return_storage_ptr__->_run_task);
  __return_storage_ptr__->_sleep_time_ms = 0;
  rVar1 = GetCurrentTick();
  AutoLock::AutoLock(&local_40,&this->_pending_lock);
  if ((this->_thread_should_quit & 1U) == 0) {
    sVar2 = std::
            map<dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>,_std::less<dd::TaskQueueStdlib::DelayedEntryTimeout>,_std::allocator<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
            ::size(&this->_delayed_queue);
    if (sVar2 != 0) {
      delay_info = (DelayedEntryTimeout *)
                   std::
                   map<dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>,_std::less<dd::TaskQueueStdlib::DelayedEntryTimeout>,_std::allocator<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                   ::begin(&this->_delayed_queue);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>
                             *)&delay_info);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>
                             *)&delay_info);
      if ((ppVar3->first)._next_fire_at_ms <= rVar1) {
        sVar5 = std::
                queue<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>_>
                ::size(&this->_pending_queue);
        if (sVar5 != 0) {
          pvVar6 = std::
                   queue<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>_>
                   ::front(&this->_pending_queue);
          if (pvVar6->first < (ppVar3->first)._order) {
            std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>::operator=
                      (&__return_storage_ptr__->_run_task,&pvVar6->second);
            std::
            queue<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>_>
            ::pop(&this->_pending_queue);
            goto LAB_00197639;
          }
        }
        std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>::operator=
                  (&__return_storage_ptr__->_run_task,&ppVar4->second);
        std::
        map<dd::TaskQueueStdlib::DelayedEntryTimeout,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>,std::less<dd::TaskQueueStdlib::DelayedEntryTimeout>,std::allocator<std::pair<dd::TaskQueueStdlib::DelayedEntryTimeout_const,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>
        ::erase_abi_cxx11_((map<dd::TaskQueueStdlib::DelayedEntryTimeout,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>,std::less<dd::TaskQueueStdlib::DelayedEntryTimeout>,std::allocator<std::pair<dd::TaskQueueStdlib::DelayedEntryTimeout_const,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>
                            *)&this->_delayed_queue,(iterator)delay_info);
        goto LAB_00197639;
      }
      __return_storage_ptr__->_sleep_time_ms = (ppVar3->first)._next_fire_at_ms - rVar1;
    }
    sVar5 = std::
            queue<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>_>
            ::size(&this->_pending_queue);
    if (sVar5 != 0) {
      pvVar6 = std::
               queue<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>_>
               ::front(&this->_pending_queue);
      std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>::operator=
                (&__return_storage_ptr__->_run_task,&pvVar6->second);
      std::
      queue<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>_>
      ::pop(&this->_pending_queue);
    }
  }
  else {
    __return_storage_ptr__->_final_task = true;
  }
LAB_00197639:
  delayed_entry._M_node._4_4_ = 1;
  AutoLock::~AutoLock(&local_40);
  return __return_storage_ptr__;
}

Assistant:

dd::TaskQueueStdlib::NextTask TaskQueueStdlib::GetNextTask()
	{
		NextTask result{};
		auto tick = GetCurrentTick();
		AutoLock lock(_pending_lock);
		if (_thread_should_quit) {
			result._final_task = true;
			return result;
		}

		if (_delayed_queue.size() > 0) {
			auto delayed_entry = _delayed_queue.begin();
			const auto& delay_info = delayed_entry->first;
			auto& delay_run = delayed_entry->second;
			if (tick >= delay_info._next_fire_at_ms) {
				if (_pending_queue.size() > 0) {
					auto& entry = _pending_queue.front();
					auto& entry_order = entry.first;
					auto& entry_run = entry.second;
					if (entry_order < delay_info._order){
						result._run_task = std::move(entry_run);
						_pending_queue.pop();
						return result;
					}
				}

				result._run_task = std::move(delay_run);
				_delayed_queue.erase(delayed_entry);
				return result;
			}
			result._sleep_time_ms = delay_info._next_fire_at_ms - tick;
		}

		if (_pending_queue.size() > 0) {
			auto& entry = _pending_queue.front();
			result._run_task = std::move(entry.second);
			_pending_queue.pop();
		}
		return result;
	}